

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

Option * __thiscall
CLI::App::set_version_flag
          (App *this,string *flag_name,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *vfunc,string *version_help)

{
  pointer pcVar1;
  Option *pOVar2;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  code *local_78;
  undefined8 uStack_70;
  string local_68;
  string local_48;
  
  if (this->version_ptr_ != (Option *)0x0) {
    remove_option(this,this->version_ptr_);
    this->version_ptr_ = (Option *)0x0;
  }
  if (flag_name->_M_string_length != 0) {
    pcVar1 = (flag_name->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + flag_name->_M_string_length);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_88,vfunc);
    local_98 = (code *)0x0;
    pcStack_90 = (code *)0x0;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    local_a8._M_unused._M_object = operator_new(0x20);
    *(undefined8 *)local_a8._M_unused._0_8_ = 0;
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = 0;
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x10) = 0;
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x18) = uStack_70;
    if (local_78 != (code *)0x0) {
      *(void **)local_a8._M_unused._0_8_ = local_88._M_unused._M_object;
      *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = local_88._8_8_;
      *(code **)((long)local_a8._M_unused._0_8_ + 0x10) = local_78;
      local_78 = (code *)0x0;
      uStack_70 = 0;
    }
    pcStack_90 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/include/CLI/impl/App_inl.hpp:311:42)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/include/CLI/impl/App_inl.hpp:311:42)>
               ::_M_manager;
    pcVar1 = (version_help->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + version_help->_M_string_length);
    pOVar2 = add_flag_callback(this,&local_48,(function<void_()> *)&local_a8,&local_68);
    this->version_ptr_ = pOVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    (this->version_ptr_->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  return this->version_ptr_;
}

Assistant:

CLI11_INLINE Option *
App::set_version_flag(std::string flag_name, std::function<std::string()> vfunc, const std::string &version_help) {
    if(version_ptr_ != nullptr) {
        remove_option(version_ptr_);
        version_ptr_ = nullptr;
    }

    // Empty name will simply remove the version flag
    if(!flag_name.empty()) {
        version_ptr_ =
            add_flag_callback(flag_name, [vfunc]() { throw(CLI::CallForVersion(vfunc(), 0)); }, version_help);
        version_ptr_->configurable(false);
    }

    return version_ptr_;
}